

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Throw.cpp
# Opt level: O0

void Js::Throw::StackOverflow(ScriptContext *scriptContext,PVOID returnAddress)

{
  code *pcVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 *in_FS_OFFSET;
  PVOID returnAddress_local;
  ScriptContext *scriptContext_local;
  
  if ((Configuration::Global[0x23441] & 1) != 0) {
    Output::Print(L"SystemException: StackOverflow\n");
    Output::Flush();
  }
  bVar2 = JsUtil::ExternalApi::RaiseStackOverflowIfScriptActive(scriptContext,returnAddress);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/Throw.cpp"
                         ,0x9a,"(false)","We shouldn\'t be here");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&StackOverflowException::typeinfo,0);
}

Assistant:

void Throw::StackOverflow(ScriptContext *scriptContext, PVOID returnAddress)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(PrintSystemException))
        {
            Output::Print(_u("SystemException: StackOverflow\n"));
            Output::Flush();
        }
#endif
        if (JsUtil::ExternalApi::RaiseStackOverflowIfScriptActive(scriptContext, returnAddress))
        {
            AssertMsg(false, "We shouldn't be here");
        }
        throw StackOverflowException();
    }